

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_9195::verifyPixelsAreEqual<unsigned_int>
               (FlatImageChannel *c1,FlatImageChannel *c2,int dx,int dy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ImageLevel *this;
  Box2i *pBVar6;
  int *piVar7;
  ArgExc *this_00;
  int in_EDX;
  undefined8 in_RSI;
  ImageChannel *in_RDI;
  int x;
  int y;
  int yStep;
  int xStep;
  Box2i *dataWindow;
  TypedFlatImageChannel<unsigned_int> *tc2;
  TypedFlatImageChannel<unsigned_int> *tc1;
  int local_40;
  int local_3c;
  
  lVar4 = __dynamic_cast(in_RDI,&Imf_3_2::FlatImageChannel::typeinfo,
                         &Imf_3_2::TypedFlatImageChannel<unsigned_int>::typeinfo,0);
  if (lVar4 == 0) {
    __cxa_bad_cast();
  }
  lVar5 = __dynamic_cast(in_RSI,&Imf_3_2::FlatImageChannel::typeinfo,
                         &Imf_3_2::TypedFlatImageChannel<unsigned_int>::typeinfo,0);
  if (lVar5 == 0) {
    __cxa_bad_cast();
  }
  this = Imf_3_2::ImageChannel::level(in_RDI);
  pBVar6 = Imf_3_2::ImageLevel::dataWindow(this);
  iVar2 = Imf_3_2::ImageChannel::xSampling(in_RDI);
  iVar3 = Imf_3_2::ImageChannel::ySampling(in_RDI);
  local_3c = (pBVar6->min).y;
  do {
    if ((pBVar6->max).y < local_3c) {
      return;
    }
    for (local_40 = (pBVar6->min).x; local_40 <= (pBVar6->max).x; local_40 = iVar2 + local_40) {
      piVar7 = (int *)Imf_3_2::TypedFlatImageChannel<unsigned_int>::at((int)lVar4,local_40);
      iVar1 = *piVar7;
      piVar7 = (int *)Imf_3_2::TypedFlatImageChannel<unsigned_int>::at((int)lVar5,local_40 + in_EDX)
      ;
      if (iVar1 != *piVar7) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this_00,"different pixel values");
        __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    local_3c = iVar3 + local_3c;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual (
    const FlatImageChannel& c1, const FlatImageChannel& c2, int dx, int dy)
{
    const TypedFlatImageChannel<T>& tc1 =
        dynamic_cast<const TypedFlatImageChannel<T>&> (c1);

    const TypedFlatImageChannel<T>& tc2 =
        dynamic_cast<const TypedFlatImageChannel<T>&> (c2);

    const Box2i& dataWindow = c1.level ().dataWindow ();
    int          xStep      = c1.xSampling ();
    int          yStep      = c1.ySampling ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            if (tc1.at (x, y) != tc2.at (x + dx, y + dy))
                throw ArgExc ("different pixel values");
}